

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void activate_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table,_Bool active)

{
  long lVar1;
  int32_t iVar2;
  long *plVar3;
  void *pvVar4;
  int32_t dst_count;
  ecs_matched_table_t *mt;
  int32_t index;
  int32_t count;
  int32_t i;
  ecs_table_indices_t *ti;
  ecs_data_t *peStack_38;
  int32_t activated;
  ecs_vector_t *dst_array;
  ecs_vector_t *src_array;
  ecs_table_t *peStack_20;
  _Bool active_local;
  ecs_table_t *table_local;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  ti._4_4_ = 0;
  if (active) {
    dst_array = query->empty_tables;
    peStack_38 = (ecs_data_t *)query->tables;
  }
  else {
    dst_array = query->tables;
    peStack_38 = (ecs_data_t *)query->empty_tables;
  }
  src_array._7_1_ = active;
  peStack_20 = table;
  table_local = (ecs_table_t *)query;
  query_local = (ecs_query_t *)world;
  plVar3 = (long *)_ecs_map_get(query->table_indices,0x10,(ulong)table->id);
  if (plVar3 != (long *)0x0) {
    lVar1 = plVar3[1];
    for (index = 0; index < (int)lVar1; index = index + 1) {
      mt._4_4_ = *(int *)(*plVar3 + (long)index * 4);
      if (mt._4_4_ < 0) {
        if ((src_array._7_1_ & 1) != 0) {
          mt._4_4_ = -1 - mt._4_4_;
LAB_0012433c:
          pvVar4 = _ecs_vector_get(dst_array,0x50,0x10,mt._4_4_);
          _ecs_assert(*(ecs_table_t **)((long)pvVar4 + 8) == peStack_20,0xc,(char *)0x0,
                      "mt->iter_data.table == table",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x6f2);
          if (*(ecs_table_t **)((long)pvVar4 + 8) != peStack_20) {
            __assert_fail("mt->iter_data.table == table",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x6f2,
                          "void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)")
            ;
          }
          ti._4_4_ = ti._4_4_ + 1;
          iVar2 = move_table((ecs_query_t *)table_local,peStack_20,mt._4_4_,
                             (ecs_vector_t **)&stack0xffffffffffffffc8,dst_array,
                             (_Bool)(src_array._7_1_ & 1));
          *(int32_t *)(*plVar3 + (long)index * 4) = iVar2;
        }
      }
      else if ((src_array._7_1_ & 1) == 0) goto LAB_0012433c;
    }
    if ((ti._4_4_ != 0) && (table_local->on_set != (ecs_vector_t **)0x0)) {
      iVar2 = ecs_vector_count((ecs_vector_t *)peStack_38);
      if ((src_array._7_1_ & 1) == 0) {
        iVar2 = ecs_vector_count(dst_array);
        if (iVar2 == 0) {
          ecs_system_activate((ecs_world_t *)query_local,(ecs_entity_t)table_local->on_set,false,
                              (EcsSystem *)0x0);
        }
      }
      else if (iVar2 == 1) {
        ecs_system_activate((ecs_world_t *)query_local,(ecs_entity_t)table_local->on_set,true,
                            (EcsSystem *)0x0);
      }
    }
    if ((src_array._7_1_ & 1) == 0) {
      table_local->queries = (ecs_vector_t *)peStack_38;
    }
    else {
      table_local->data = peStack_38;
    }
  }
  if (ti._4_4_ == 0) {
    _ecs_assert((table_local->bs_column_count & 0x100U) != 0,0xc,(char *)0x0,
                "(query->flags & EcsQueryIsSubquery) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x716);
    if ((table_local->bs_column_count & 0x100U) == 0) {
      __assert_fail("(query->flags & (256)) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x716,"void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)"
                   );
    }
  }
  else {
    *(undefined1 *)&table_local[1].c_info = 1;
  }
  return;
}

Assistant:

static
void activate_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table,
    bool active)
{
    (void)world;
    
    ecs_vector_t *src_array, *dst_array;
    int32_t activated = 0;

    if (active) {
        src_array = query->empty_tables;
        dst_array = query->tables;
    } else {
        src_array = query->tables;
        dst_array = query->empty_tables;
    }

    ecs_table_indices_t *ti = ecs_map_get(
        query->table_indices, ecs_table_indices_t, table->id);

    if (ti) {
        int32_t i, count = ti->count;
        for (i = 0; i < count; i ++) {
            int32_t index = ti->indices[i];

            if (index < 0) {
                if (!active) {
                    /* If table is already inactive, no need to move */
                    continue;
                }
                index = index * -1 - 1;
            } else {
                if (active) {
                    /* If table is already active, no need to move */
                    continue;
                }
            }

            ecs_matched_table_t *mt = ecs_vector_get(
                src_array, ecs_matched_table_t, index);
            ecs_assert(mt->iter_data.table == table, ECS_INTERNAL_ERROR, NULL);
            (void)mt;
            
            activated ++;

            ti->indices[i] = move_table(
                query, table, index, &dst_array, src_array, active);
        }

        if (activated) {
            /* Activate system if registered with query */
#ifdef FLECS_SYSTEMS_H
            if (query->system) {
                int32_t dst_count = ecs_vector_count(dst_array);
                if (active) {
                    if (dst_count == 1) {
                        ecs_system_activate(world, query->system, true, NULL);
                    }
                } else if (ecs_vector_count(src_array) == 0) {
                    ecs_system_activate(world, query->system, false, NULL);
                }
            }
#endif
        }

        if (active)  {
            query->tables = dst_array;
        } else {
            query->empty_tables = dst_array;
        }
    }
    
    if (!activated) {
        /* Received an activate event for a table we're not matched with. This
         * can only happen if this is a subquery */
        ecs_assert((query->flags & EcsQueryIsSubquery) != 0, 
            ECS_INTERNAL_ERROR, NULL);
        return;
    }

    /* Signal query it needs to reorder tables. Doing this in place could slow
     * down scenario's where a large number of tables is matched with an ordered
     * query. Since each table would trigger the activate signal, there would be
     * as many sorts as added tables, vs. only one when ordering happens when an
     * iterator is obtained. */
    query->needs_reorder = true;
}